

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O1

void __thiscall IlmThread_3_4::TaskGroup::Data::removeTask(Data *this)

{
  LOCK();
  (this->numPending).super___atomic_base<int>._M_i =
       (this->numPending).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((this->numPending).super___atomic_base<int>._M_i == 0) {
    Semaphore::post(&this->isEmpty);
  }
  LOCK();
  (this->inFlight).super___atomic_base<int>._M_i =
       (this->inFlight).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  return;
}

Assistant:

void
TaskGroup::Data::removeTask ()
{
    // if we are the last task, notify the group we're done
    if (numPending.fetch_sub (1) == 1) { isEmpty.post (); }

    // in theory, a background thread could actually finish a task
    // prior to the next task being added. The fetch_add / fetch_sub
    // logic between addTask and removeTask are fine to keep the
    // inverted semaphore straight. All addTask must happen prior to
    // the TaskGroup destructor.
    //
    // But to let the taskgroup thread waiting know we're actually
    // finished with the last one and finished posting (the semaphore
    // might wake up the other thread while in the middle of post) so
    // we don't destroy the semaphore while posting to it, keep a
    // separate counter that is modified pre / post semaphore
    inFlight.fetch_sub (1);
}